

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgradientreconstruction.cpp
# Opt level: O3

void __thiscall
TPZGradientReconstruction::AssembleGlobalMatrix
          (TPZGradientReconstruction *this,TPZCompEl *el,TPZElementMatrix *ekb,TPZElementMatrix *efb
          ,TPZMatrix<double> *stiffmatrix,TPZFMatrix<double> *rhs)

{
  int iVar1;
  TPZElementMatrix *this_00;
  long *plVar2;
  long lVar3;
  
  this_00 = (TPZElementMatrix *)
            __dynamic_cast(ekb,&TPZElementMatrix::typeinfo,&TPZElementMatrixT<double>::typeinfo,0);
  if (this_00 != (TPZElementMatrix *)0x0) {
    plVar2 = (long *)__dynamic_cast(efb,&TPZElementMatrix::typeinfo,
                                    &TPZElementMatrixT<double>::typeinfo,0);
    if (plVar2 != (long *)0x0) {
      iVar1 = (**(code **)(*(long *)el + 0x1f0))(el);
      if (iVar1 == 0) {
        lVar3 = 0x1f0;
      }
      else {
        (*this_00->_vptr_TPZElementMatrix[6])(this_00);
        (**(code **)(*plVar2 + 0x30))(plVar2);
        lVar3 = 0x2298;
      }
      TPZElementMatrix::ComputeDestinationIndices(this_00);
      (*(stiffmatrix->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x34])
                (stiffmatrix,
                 (long)(this_00->fConnect).super_TPZManVector<long,_10>.fExtAlloc + lVar3 + -0x38,
                 &this_00->fSourceIndex,&this_00->fDestinationIndex);
      TPZFMatrix<double>::AddFel
                (rhs,(TPZFMatrix<double> *)((long)plVar2 + lVar3),
                 &(this_00->fSourceIndex).super_TPZVec<long>,
                 &(this_00->fDestinationIndex).super_TPZVec<long>);
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void TPZGradientReconstruction::AssembleGlobalMatrix(TPZCompEl *el, TPZElementMatrix &ekb, TPZElementMatrix &efb,TPZMatrix<STATE> & stiffmatrix, TPZFMatrix<STATE> &rhs){
    //TODOCOMPLEX
    auto &ek =
		dynamic_cast<TPZElementMatrixT<STATE>&>(ekb);
	auto &ef =
		dynamic_cast<TPZElementMatrixT<STATE>&>(efb);
    if(!el->HasDependency()) {
        ek.ComputeDestinationIndices();
        
        stiffmatrix.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
        rhs.AddFel(ef.fMat,ek.fSourceIndex,ek.fDestinationIndex);
        
    } else {
        // the element has dependent nodes
        ek.ApplyConstraints();
        ef.ApplyConstraints();
        ek.ComputeDestinationIndices();
        
        stiffmatrix.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
        rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
    }
}